

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  xmlAttrPtr cur_00;
  bool bVar2;
  int iVar3;
  _xmlNode *p_Var4;
  htmlElemDesc *phVar5;
  uint *encoding_00;
  _xmlNode *cur_01;
  char *str;
  xmlChar *pxVar6;
  _xmlAttr **pp_Var7;
  
  xmlInitParser();
  p_Var4 = cur;
  if (buf == (xmlOutputBufferPtr)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
LAB_0015099c:
  do {
    cur_01 = p_Var4;
    encoding_00 = &switchD_001509bb::switchdataD_001ebc8c;
    switch(cur_01->type) {
    case XML_ELEMENT_NODE:
      if (cur_01->ns == (xmlNs *)0x0) {
        phVar5 = htmlTagLookup(cur_01->name);
      }
      else {
        phVar5 = (htmlElemDesc *)0x0;
      }
      xmlOutputBufferWriteString(buf,"<");
      if ((cur_01->ns != (xmlNs *)0x0) && (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf,(char *)pxVar6);
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,(char *)cur_01->name);
      if (cur_01->nsDef != (xmlNsPtr)0x0) {
        xmlNsListDumpOutput(buf,cur_01->nsDef);
      }
      pp_Var7 = &cur_01->properties;
      while (cur_00 = *pp_Var7, cur_00 != (xmlAttrPtr)0x0) {
        htmlAttrDumpOutput(buf,doc,cur_00,(char *)encoding_00);
        pp_Var7 = &cur_00->next;
      }
      if (phVar5 == (htmlElemDesc *)0x0) {
        if (cur_01->children != (_xmlNode *)0x0) {
LAB_00150cf4:
          xmlOutputBufferWriteString(buf,">");
          if (((format != 0) && (phVar5 != (htmlElemDesc *)0x0)) && (phVar5->isinline == '\0')) {
            p_Var4 = cur_01->children;
            xVar1 = p_Var4->type;
            if (((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
               ((p_Var4 != cur_01->last &&
                ((cur_01->name != (xmlChar *)0x0 && (*cur_01->name != 'p')))))) {
              xmlOutputBufferWriteString(buf,"\n");
            }
          }
          p_Var4 = cur_01->children;
          break;
        }
      }
      else {
        if (phVar5->empty != '\0') goto LAB_00150d71;
        if (cur_01->children != (_xmlNode *)0x0) goto LAB_00150cf4;
        if (((phVar5->saveEndTag != '\0') &&
            (iVar3 = xmlStrcmp((xmlChar *)phVar5->name,"html"), iVar3 != 0)) &&
           (iVar3 = xmlStrcmp((xmlChar *)phVar5->name,"body"), iVar3 != 0)) goto LAB_00150d71;
      }
      xmlOutputBufferWriteString(buf,"></");
      if ((cur_01->ns != (xmlNs *)0x0) && (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
        xmlOutputBufferWriteString(buf,(char *)pxVar6);
        xmlOutputBufferWriteString(buf,":");
      }
      xmlOutputBufferWriteString(buf,(char *)cur_01->name);
LAB_00150d71:
      xmlOutputBufferWriteString(buf,">");
      if (format == 0) goto switchD_001509bb_caseD_6;
      p_Var4 = cur_01->next;
      if (p_Var4 == (_xmlNode *)0x0 || phVar5 == (htmlElemDesc *)0x0) goto switchD_001509bb_caseD_6;
      if (phVar5->isinline != '\0') goto switchD_001509bb_caseD_6;
LAB_00150da2:
      if (p_Var4->type == XML_TEXT_NODE) goto switchD_001509bb_caseD_6;
      if (p_Var4->type == XML_ENTITY_REF_NODE) goto switchD_001509bb_caseD_6;
      if (cur_01->parent == (_xmlNode *)0x0) goto switchD_001509bb_caseD_6;
      pxVar6 = cur_01->parent->name;
      if (pxVar6 == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      if (*pxVar6 == 'p') goto switchD_001509bb_caseD_6;
      do {
        pxVar6 = "\n";
LAB_00150dcc:
        xmlOutputBufferWriteString(buf,(char *)pxVar6);
switchD_001509bb_caseD_6:
        while( true ) {
          if (cur_01 == cur) {
            return;
          }
          p_Var4 = cur_01->next;
          if (cur_01->next != (_xmlNode *)0x0) goto LAB_0015099c;
          cur_01 = cur_01->parent;
          if (cur_01 == (_xmlNode *)0x0) {
            return;
          }
          if ((cur_01->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) break;
          if (((format == 0) || (cur_01->ns != (xmlNs *)0x0)) ||
             (phVar5 = htmlTagLookup(cur_01->name), phVar5 == (htmlElemDesc *)0x0)) {
            bVar2 = false;
            phVar5 = (htmlElemDesc *)0x0;
          }
          else {
            bVar2 = true;
            if (phVar5->isinline == '\0') {
              xVar1 = cur_01->last->type;
              if ((((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
                  (cur_01->children != cur_01->last)) &&
                 ((cur_01->name != (xmlChar *)0x0 && (*cur_01->name != 'p')))) {
                xmlOutputBufferWriteString(buf,"\n");
              }
            }
          }
          xmlOutputBufferWriteString(buf,"</");
          if ((cur_01->ns != (xmlNs *)0x0) &&
             (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
            xmlOutputBufferWriteString(buf,(char *)pxVar6);
            xmlOutputBufferWriteString(buf,":");
          }
          xmlOutputBufferWriteString(buf,(char *)cur_01->name);
          xmlOutputBufferWriteString(buf,">");
          if (((bVar2) && (phVar5->isinline == '\0')) &&
             (p_Var4 = cur_01->next, p_Var4 != (_xmlNode *)0x0)) goto LAB_00150da2;
        }
      } while( true );
    case XML_ATTRIBUTE_NODE:
      htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)cur_01,(char *)&switchD_001509bb::switchdataD_001ebc8c)
      ;
      goto switchD_001509bb_caseD_6;
    case XML_TEXT_NODE:
      pxVar6 = cur_01->content;
      if (pxVar6 == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      if (cur_01->name == "textnoenc") goto LAB_00150dcc;
      if (cur_01->parent != (_xmlNode *)0x0) {
        iVar3 = xmlStrcasecmp(cur_01->parent->name,"script");
        if (iVar3 == 0) {
          pxVar6 = cur_01->content;
          goto LAB_00150dcc;
        }
        iVar3 = xmlStrcasecmp(cur_01->parent->name,"style");
        pxVar6 = cur_01->content;
        if (iVar3 == 0) goto LAB_00150dcc;
      }
      pxVar6 = xmlEncodeEntitiesReentrant(doc,pxVar6);
      if (pxVar6 == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      xmlOutputBufferWriteString(buf,(char *)pxVar6);
      (*xmlFree)(pxVar6);
      goto switchD_001509bb_caseD_6;
    case XML_CDATA_SECTION_NODE:
      pxVar6 = cur_01->content;
      if (pxVar6 == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      goto LAB_00150dcc;
    case XML_ENTITY_REF_NODE:
      xmlOutputBufferWriteString(buf,"&");
      xmlOutputBufferWriteString(buf,(char *)cur_01->name);
      pxVar6 = ";";
      goto LAB_00150dcc;
    default:
      goto switchD_001509bb_caseD_6;
    case XML_PI_NODE:
      if (cur_01->name == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      xmlOutputBufferWriteString(buf,"<?");
      xmlOutputBufferWriteString(buf,(char *)cur_01->name);
      if (cur_01->content != (xmlChar *)0x0) {
        xmlOutputBufferWriteString(buf," ");
        xmlOutputBufferWriteString(buf,(char *)cur_01->content);
      }
      pxVar6 = ">";
      goto LAB_00150dcc;
    case XML_COMMENT_NODE:
      if (cur_01->content == (xmlChar *)0x0) goto switchD_001509bb_caseD_6;
      xmlOutputBufferWriteString(buf,"<!--");
      xmlOutputBufferWriteString(buf,(char *)cur_01->content);
      pxVar6 = "-->";
      goto LAB_00150dcc;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
      pxVar6 = cur_01->content;
      if (pxVar6 != (xmlChar *)0x0) {
        xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
        xmlOutputBufferWriteString(buf,*(char **)(pxVar6 + 0x10));
        if (*(long *)(pxVar6 + 0x68) == 0) {
          if ((*(xmlChar **)(pxVar6 + 0x70) != (xmlChar *)0x0) &&
             (iVar3 = xmlStrcmp(*(xmlChar **)(pxVar6 + 0x70),(xmlChar *)"about:legacy-compat"),
             iVar3 != 0)) {
            str = " SYSTEM ";
            goto LAB_00150bdb;
          }
        }
        else {
          xmlOutputBufferWriteString(buf," PUBLIC ");
          xmlBufWriteQuotedString(buf->buffer,*(xmlChar **)(pxVar6 + 0x68));
          if (*(long *)(pxVar6 + 0x70) != 0) {
            str = " ";
LAB_00150bdb:
            xmlOutputBufferWriteString(buf,str);
            xmlBufWriteQuotedString(buf->buffer,*(xmlChar **)(pxVar6 + 0x70));
          }
        }
        xmlOutputBufferWriteString(buf,">\n");
      }
      p_Var4 = cur_01->children;
      if (cur_01->children == (_xmlNode *)0x0) goto switchD_001509bb_caseD_6;
    }
  } while( true );
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding, int format) {
    xmlNodePtr root;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr, encoding);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (cur->parent != NULL) &&
                    (cur->parent->name != NULL) &&
                    (cur->parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur, encoding);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((cur->parent == NULL) ||
                 ((xmlStrcasecmp(cur->parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(cur->parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer != NULL) {
                    xmlOutputBufferWriteString(buf, (const char *)buffer);
                    xmlFree(buffer);
                }
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (cur->parent != NULL) &&
                        (cur->parent->name != NULL) &&
                        (cur->parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}